

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RPLIDAR.h
# Opt level: O0

int StartOtherScanRequestRPLIDAR(RPLIDAR *pRPLIDAR,int scanmodeid)

{
  int iVar1;
  int local_34;
  int local_30;
  int DataType;
  int SendMode;
  int DataResponseLength;
  uchar reqbuf [9];
  int scanmodeid_local;
  RPLIDAR *pRPLIDAR_local;
  
  reqbuf[0] = '\0';
  DataType = 0;
  local_30 = 0;
  local_34 = 0;
  stack0xffffffffffffffdb = (ulong)CONCAT13((char)scanmodeid,0x582a5);
  reqbuf._1_4_ = scanmodeid;
  unique0x1000022c = pRPLIDAR;
  reqbuf[0] = ComputeChecksumRPLIDAR((uchar *)((long)&SendMode + 3),9);
  iVar1 = WriteAllRS232Port(&stack0xffffffffffffffe8->RS232Port,(uint8 *)((long)&SendMode + 3),9);
  if (iVar1 == 0) {
    iVar1 = GetResponseDescriptorRPLIDAR(stack0xffffffffffffffe8,&DataType,&local_30,&local_34);
    if (iVar1 == 0) {
      if ((((DataType == 0x54) || (DataType == 0x84)) || (DataType == 0x54)) &&
         ((local_30 == 1 && (((local_34 == 0x82 || (local_34 == 0x84)) || (local_34 == 0x85)))))) {
        iVar1 = WaitForRS232Port(&stack0xffffffffffffffe8->RS232Port,0x5dc,5);
        if (iVar1 == 0) {
          stack0xffffffffffffffe8->esversion = local_34;
          iVar1 = stack0xffffffffffffffe8->esversion;
          if (iVar1 == 0x82) {
            memset(stack0xffffffffffffffe8->esdata_prev,0,0x54);
            iVar1 = GetRawExpressScanDataResponseRPLIDAR
                              (stack0xffffffffffffffe8,stack0xffffffffffffffe8->esdata_prev,0x54);
            if (iVar1 != 0) {
              return 1;
            }
          }
          else {
            if (iVar1 == 0x84) {
              memset(stack0xffffffffffffffe8->eesdata_prev,0,0x84);
              iVar1 = GetRawExpressScanDataResponseRPLIDAR
                                (stack0xffffffffffffffe8,stack0xffffffffffffffe8->eesdata_prev,0x84)
              ;
              if (iVar1 != 0) {
                return 1;
              }
              printf(
                    "A RPLIDAR is not responding correctly : Unhandled response descriptor, please try another scan mode or rebuild using RPLIDAR SDK. \n"
                    );
              return 0x11;
            }
            if (iVar1 != 0x85) {
              printf("A RPLIDAR is not responding correctly : Unhandled response descriptor. \n");
              return 1;
            }
            memset(stack0xffffffffffffffe8->desdata_prev,0,0x54);
            iVar1 = GetRawExpressScanDataResponseRPLIDAR
                              (stack0xffffffffffffffe8,stack0xffffffffffffffe8->desdata_prev,0x54);
            if (iVar1 != 0) {
              return 1;
            }
          }
          pRPLIDAR_local._4_4_ = 0;
        }
        else {
          printf("A RPLIDAR is not responding correctly. \n");
          pRPLIDAR_local._4_4_ = 1;
        }
      }
      else {
        printf("A RPLIDAR is not responding correctly : Bad response descriptor. \n");
        pRPLIDAR_local._4_4_ = 1;
      }
    }
    else {
      pRPLIDAR_local._4_4_ = 1;
    }
  }
  else {
    printf("Error writing data to a RPLIDAR. \n");
    pRPLIDAR_local._4_4_ = 1;
  }
  return pRPLIDAR_local._4_4_;
}

Assistant:

inline int StartOtherScanRequestRPLIDAR(RPLIDAR* pRPLIDAR, int scanmodeid)
{
#ifdef ENABLE_RPLIDAR_SDK_SUPPORT
	if (SL_IS_FAIL(pRPLIDAR->drv->startScanExpress(false, (unsigned short)scanmodeid)))
	{
		printf("A RPLIDAR is not responding correctly : startScanExpress() failed. \n");
		return EXIT_FAILURE;
	}
#else
	unsigned char reqbuf[] = {START_FLAG1_RPLIDAR,EXPRESS_SCAN_REQUEST_RPLIDAR,0x05,0,0,0,0,0,0};
	int DataResponseLength = 0, SendMode = 0, DataType = 0;

	reqbuf[3] = (unsigned char)scanmodeid;
	reqbuf[8] = ComputeChecksumRPLIDAR(reqbuf, sizeof(reqbuf));

	// Send request.
	if (WriteAllRS232Port(&pRPLIDAR->RS232Port, reqbuf, sizeof(reqbuf)) != EXIT_SUCCESS)
	{
		printf("Error writing data to a RPLIDAR. \n");
		return EXIT_FAILURE;
	}

	// Receive the response descriptor.
	if (GetResponseDescriptorRPLIDAR(pRPLIDAR, &DataResponseLength, &SendMode, &DataType) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}

	// Quick check of the response descriptor.
	if (((DataResponseLength != NB_BYTES_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR)&&(DataResponseLength != NB_BYTES_EXTENDED_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR)&&(DataResponseLength != NB_BYTES_DENSE_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR))||
		(SendMode != SINGLE_REQUEST_MULTIPLE_RESPONSE_SEND_MODE_RPLIDAR)||
		((DataType != MEASUREMENT_CAPSULED_RESPONSE_RPLIDAR)&&(DataType != MEASUREMENT_CAPSULED_ULTRA_RESPONSE_RPLIDAR)&&(DataType != MEASUREMENT_DENSE_CAPSULED_RESPONSE_RPLIDAR)))
	{ 
		printf("A RPLIDAR is not responding correctly : Bad response descriptor. \n");
		return EXIT_FAILURE;	
	}

	// The first data response might take some time to come, see https://github.com/ENSTABretagneRobotics/Hardware-MATLAB/issues/2...
	if (WaitForRS232Port(&pRPLIDAR->RS232Port, 1500, 5) != EXIT_SUCCESS)
	{
		printf("A RPLIDAR is not responding correctly. \n");
		return EXIT_FAILURE;
	}

	pRPLIDAR->esversion = DataType;

	// Receive the first data response (2 data responses needed for angles computation...).
	switch (pRPLIDAR->esversion)
	{
	case MEASUREMENT_CAPSULED_RESPONSE_RPLIDAR:
		PRINT_DEBUG_MESSAGE(("RPLIDAR Legacy Express Scan\n"));
		memset(pRPLIDAR->esdata_prev, 0, sizeof(pRPLIDAR->esdata_prev));
		if (GetRawExpressScanDataResponseRPLIDAR(pRPLIDAR, pRPLIDAR->esdata_prev, NB_BYTES_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR) != EXIT_SUCCESS)
		{
			return EXIT_FAILURE;
		}
		break;
	case MEASUREMENT_CAPSULED_ULTRA_RESPONSE_RPLIDAR:
		PRINT_DEBUG_MESSAGE(("RPLIDAR Extended Express Scan\n"));
		memset(pRPLIDAR->eesdata_prev, 0, sizeof(pRPLIDAR->eesdata_prev));
		if (GetRawExpressScanDataResponseRPLIDAR(pRPLIDAR, pRPLIDAR->eesdata_prev, NB_BYTES_EXTENDED_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR) != EXIT_SUCCESS)
		{
			return EXIT_FAILURE;
		}

		// Need to update GetOtherScanDataResponseRPLIDAR()...

		printf("A RPLIDAR is not responding correctly : Unhandled response descriptor, please try another scan mode or rebuild using RPLIDAR SDK. \n");
		return EXIT_NOT_IMPLEMENTED;
		//break;
	case MEASUREMENT_DENSE_CAPSULED_RESPONSE_RPLIDAR:
		PRINT_DEBUG_MESSAGE(("RPLIDAR Dense Express Scan\n"));
		memset(pRPLIDAR->desdata_prev, 0, sizeof(pRPLIDAR->desdata_prev));
		if (GetRawExpressScanDataResponseRPLIDAR(pRPLIDAR, pRPLIDAR->desdata_prev, NB_BYTES_DENSE_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR) != EXIT_SUCCESS)
		{
			return EXIT_FAILURE;
		}
		break;
	default:
		printf("A RPLIDAR is not responding correctly : Unhandled response descriptor. \n");
		return EXIT_FAILURE;
		//break;
	}
#endif // ENABLE_RPLIDAR_SDK_SUPPORT
	return EXIT_SUCCESS;
}